

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metaCommand.cxx
# Opt level: O3

int __thiscall MetaCommand::GetValueAsInt(MetaCommand *this,string *optionName,string *fieldName)

{
  pointer pcVar1;
  pointer pOVar2;
  size_t __n;
  pointer pFVar3;
  undefined1 *__s2;
  int iVar4;
  pointer pFVar5;
  pointer pOVar6;
  string fieldname;
  undefined1 *local_50;
  size_t local_48;
  undefined1 local_40 [16];
  
  local_50 = local_40;
  pcVar1 = (fieldName->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + fieldName->_M_string_length);
  if (fieldName->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)&local_50);
  }
  __s2 = local_50;
  pOVar6 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_start;
  pOVar2 = (this->m_OptionVector).
           super__Vector_base<MetaCommand::Option,_std::allocator<MetaCommand::Option>_>._M_impl.
           super__Vector_impl_data._M_finish;
  iVar4 = 0;
  if (pOVar6 != pOVar2) {
    __n = optionName->_M_string_length;
    do {
      if ((pOVar6->name)._M_string_length == __n) {
        if (__n != 0) {
          iVar4 = bcmp((pOVar6->name)._M_dataplus._M_p,(optionName->_M_dataplus)._M_p,__n);
          if (iVar4 != 0) goto LAB_001190bf;
        }
        pFVar3 = (pOVar6->fields).
                 super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>._M_impl
                 .super__Vector_impl_data._M_finish;
        for (pFVar5 = (pOVar6->fields).
                      super__Vector_base<MetaCommand::Field,_std::allocator<MetaCommand::Field>_>.
                      _M_impl.super__Vector_impl_data._M_start; pFVar5 != pFVar3;
            pFVar5 = pFVar5 + 1) {
          if ((pFVar5->name)._M_string_length == local_48) {
            if (local_48 != 0) {
              iVar4 = bcmp((pFVar5->name)._M_dataplus._M_p,__s2,local_48);
              if (iVar4 != 0) goto LAB_001190f6;
            }
            iVar4 = atoi((pFVar5->value)._M_dataplus._M_p);
            goto LAB_00119118;
          }
LAB_001190f6:
        }
      }
LAB_001190bf:
      pOVar6 = pOVar6 + 1;
    } while (pOVar6 != pOVar2);
    iVar4 = 0;
  }
LAB_00119118:
  if (__s2 != local_40) {
    operator_delete(__s2);
  }
  return iVar4;
}

Assistant:

int MetaCommand::GetValueAsInt(METAIO_STL::string optionName,METAIO_STL::string fieldName)
{
  METAIO_STL::string fieldname = fieldName;
  if (fieldName.empty()) {
    fieldname = optionName;
  }

  OptionVector::const_iterator it = m_OptionVector.begin();
  while(it != m_OptionVector.end())
    {
    if((*it).name == optionName)
      {
      auto itField = (*it).fields.begin();
      while(itField != (*it).fields.end())
        {
        if((*itField).name == fieldname)
          {
          return atoi((*itField).value.c_str());
          }
        ++itField;
        }
      }
    ++it;
    }
  return 0;
}